

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O3

void __thiscall Sample::Sample(Sample *this,char *filename)

{
  ALLEGRO_SAMPLE *pAVar1;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  pAVar1 = (ALLEGRO_SAMPLE *)al_load_sample(filename);
  this->spl = pAVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,filename,&local_41);
  basename((char *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

Sample::Sample(char const *filename)
{
   spl = al_load_sample(filename);
   basename(filename, this->filename);
}